

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InliningDecider.cpp
# Opt level: O2

bool InliningDecider::GetBuiltInInfoCommon
               (uint localFuncId,OpCode *inlineCandidateOpCode,ValueType *returnType)

{
  bool bVar1;
  ObjectType OVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar3;
  ValueType *pVVar4;
  ObjectType objectType;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_30;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  
  bVar1 = false;
  switch(localFuncId) {
  case 0xb6:
  case 0xd3:
    local_2e.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_30.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_2e.field_0,true);
    local_2a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetArrayTypeId((ValueType *)&local_30.field_0,TypeIds_Array);
    ValueType::Verify((ValueType)local_2a.field_0);
    ValueType::Verify((ValueType)0x4);
    bVar1 = ValueType::operator==((ValueType *)&local_2a.field_0,(ValueType)0x4);
    if (!bVar1) {
      ValueType::ValueType
                ((ValueType *)&local_2c.field_0,
                 local_2a.bits | (ushort)(anon_union_2_4_ea848c7b_for_ValueType_13)0x4);
      bVar1 = ValueType::OneOn((ValueType *)&local_2c.field_0,Object);
      if (bVar1) {
        local_2a.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::MergeWithObject((ValueType *)&local_2a.field_0,(ValueType)0x4);
      }
      else {
        local_2a.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             ValueType::Verify(local_2c.field_0);
      }
    }
    goto LAB_0051302f;
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc0:
  case 0xc1:
  case 0xc2:
  case 0xc3:
  case 0xc4:
  case 0xc5:
  case 0xc6:
  case 199:
  case 200:
  case 0xcc:
  case 0xd2:
  case 0xd4:
  case 0xd5:
  case 0xdf:
  case 0xe3:
  case 0xe5:
  case 0xe6:
  case 0xe7:
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xeb:
  case 0xec:
  case 0xed:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf1:
  case 0xf3:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
  case 0xf8:
  case 0xfb:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
  case 0x100:
  case 0x101:
  case 0x102:
  case 0x103:
  case 0x104:
  case 0x117:
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11b:
  case 0x11c:
  case 0x11d:
  case 0x11e:
  case 0x11f:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x123:
  case 0x124:
    goto switchD_00512fc6_caseD_b7;
  case 0xbb:
  case 0xcb:
  case 0xd0:
  case 0xd1:
  case 0xd7:
switchD_00512fc6_caseD_bb:
    local_2a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetNumberAndLikelyInt(true);
    goto LAB_0051302f;
  case 0xc9:
  case 0xf2:
    goto switchD_00512fc6_caseD_c9;
  case 0xca:
  case 0xcd:
  case 0xce:
  case 0xcf:
  case 0xd6:
  case 0xd8:
  case 0xda:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xe0:
  case 0xe1:
  case 0xe2:
  case 0xe4:
  case 0xf9:
  case 0xfa:
switchD_00512fc6_caseD_ca:
    pVVar4 = &ValueType::String;
LAB_00512fcf:
    local_2a = pVVar4->field_0;
    goto LAB_0051302f;
  case 0xd9:
    local_2a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(Array);
    local_2c.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetHasNoMissingValues((ValueType *)&local_2a.field_0,true);
    local_2a.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::SetArrayTypeId((ValueType *)&local_2c.field_0,TypeIds_Array);
LAB_0051302f:
    (returnType->field_0).field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_2a;
switchD_00512fc6_caseD_c9:
    *inlineCandidateOpCode = CallDirect;
    break;
  case 0x105:
    *inlineCandidateOpCode = InlineMathAbs;
    break;
  case 0x106:
    *inlineCandidateOpCode = InlineMathAcos;
    break;
  case 0x107:
    *inlineCandidateOpCode = InlineMathAsin;
    break;
  case 0x108:
    *inlineCandidateOpCode = InlineMathAtan;
    break;
  case 0x109:
    *inlineCandidateOpCode = InlineMathAtan2;
    break;
  case 0x10a:
    *inlineCandidateOpCode = InlineMathCeil;
    break;
  case 0x10b:
    *inlineCandidateOpCode = InlineMathCos;
    break;
  case 0x10c:
    *inlineCandidateOpCode = InlineMathExp;
    break;
  case 0x10d:
    *inlineCandidateOpCode = InlineMathFloor;
    break;
  case 0x10e:
    *inlineCandidateOpCode = InlineMathLog;
    break;
  case 0x10f:
    *inlineCandidateOpCode = InlineMathMax;
    break;
  case 0x110:
    *inlineCandidateOpCode = InlineMathMin;
    break;
  case 0x111:
    *inlineCandidateOpCode = InlineMathPow;
    break;
  case 0x112:
    *inlineCandidateOpCode = InlineMathRandom;
    break;
  case 0x113:
    *inlineCandidateOpCode = InlineMathRound;
    break;
  case 0x114:
    *inlineCandidateOpCode = InlineMathSin;
    break;
  case 0x115:
    *inlineCandidateOpCode = InlineMathSqrt;
    break;
  case 0x116:
    *inlineCandidateOpCode = InlineMathTan;
    break;
  case 0x125:
    *inlineCandidateOpCode = InlineMathImul;
    break;
  case 0x126:
    *inlineCandidateOpCode = InlineMathClz;
    break;
  default:
    bVar1 = false;
    switch(localFuncId) {
    case 4:
    case 0x19:
    case 0x1c:
    case 0x2a:
      goto switchD_00512fc6_caseD_bb;
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x1d:
    case 0x20:
    case 0x21:
    case 0x25:
    case 0x26:
    case 0x28:
    case 0x29:
      goto switchD_00512fc6_caseD_b7;
    case 0x13:
      local_2a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::GetObject(Array);
      local_2c.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetHasNoMissingValues((ValueType *)&local_2a.field_0,true);
      aVar3.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::SetArrayTypeId((ValueType *)&local_2c.field_0,TypeIds_Array);
      goto LAB_005133b6;
    case 0x14:
    case 0x15:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x27:
      goto switchD_00512fc6_caseD_c9;
    case 0x1a:
    case 0x2b:
switchD_00513025_caseD_1a:
      pVVar4 = &ValueType::Boolean;
      goto LAB_00512fcf;
    case 0x1b:
      goto switchD_00512fc6_caseD_ca;
    case 0x1e:
      *inlineCandidateOpCode = InlineArrayPop;
      goto LAB_005133b9;
    case 0x1f:
      *inlineCandidateOpCode = InlineArrayPush;
      goto LAB_005133b9;
    }
    switch(localFuncId) {
    case 0x161:
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TypedArrayVirtualPhase);
      bVar1 = !bVar1;
      OVar2 = Int8Array;
      objectType = Int8MixedArray;
      break;
    case 0x162:
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TypedArrayVirtualPhase);
      bVar1 = !bVar1;
      OVar2 = Uint8Array;
      objectType = Uint8MixedArray;
      break;
    case 0x163:
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TypedArrayVirtualPhase);
      bVar1 = !bVar1;
      OVar2 = Uint8ClampedArray;
      objectType = Uint8ClampedMixedArray;
      break;
    case 0x164:
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TypedArrayVirtualPhase);
      bVar1 = !bVar1;
      OVar2 = Int16Array;
      objectType = Int16MixedArray;
      break;
    case 0x165:
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TypedArrayVirtualPhase);
      bVar1 = !bVar1;
      OVar2 = Uint16Array;
      objectType = Uint16MixedArray;
      break;
    case 0x166:
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TypedArrayVirtualPhase);
      bVar1 = !bVar1;
      OVar2 = Int32Array;
      objectType = Int32MixedArray;
      break;
    case 0x167:
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TypedArrayVirtualPhase);
      bVar1 = !bVar1;
      OVar2 = Uint32Array;
      objectType = Uint32MixedArray;
      break;
    case 0x168:
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TypedArrayVirtualPhase);
      bVar1 = !bVar1;
      OVar2 = Float32Array;
      objectType = Float32MixedArray;
      break;
    case 0x169:
      bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TypedArrayVirtualPhase);
      bVar1 = !bVar1;
      OVar2 = Float64Array;
      objectType = Float64MixedArray;
      break;
    case 0x16a:
      objectType = Int64Array;
      goto LAB_005133b1;
    case 0x16b:
      objectType = Uint64Array;
      goto LAB_005133b1;
    case 0x16c:
      objectType = CharArray;
      goto LAB_005133b1;
    case 0x16d:
      objectType = BoolArray;
      goto LAB_005133b1;
    default:
      if (localFuncId == 0x80) {
        *inlineCandidateOpCode = InlineFunctionApply;
      }
      else if (localFuncId == 0x82) {
        *inlineCandidateOpCode = InlineFunctionCall;
      }
      else {
        if ((localFuncId == 0x94) || (localFuncId == 0x96)) goto switchD_00513025_caseD_1a;
        if (localFuncId == 0x13d) {
          *inlineCandidateOpCode = InlineMathFround;
          aVar3.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               (anon_union_2_4_ea848c7b_for_ValueType_13)0x108;
          goto LAB_005133b6;
        }
        if (localFuncId != 0x1ea) {
          return false;
        }
        *inlineCandidateOpCode = InlineCallInstanceFunction;
      }
      goto LAB_005133b9;
    }
    if (!bVar1) {
      objectType = OVar2;
    }
LAB_005133b1:
    aVar3.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ValueType::GetObject(objectType);
LAB_005133b6:
    (returnType->field_0).field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)aVar3;
  }
LAB_005133b9:
  bVar1 = true;
switchD_00512fc6_caseD_b7:
  return bVar1;
}

Assistant:

bool InliningDecider::GetBuiltInInfoCommon(
    uint localFuncId,
    Js::OpCode *const inlineCandidateOpCode,
    ValueType *const returnType
    )
{
    // TODO: consider adding another column to JavascriptBuiltInFunctionList.h/LibraryFunction.h
    // and getting helper method from there instead of multiple switch labels. And for return value types too.
    switch (localFuncId)
    {
    case Js::JavascriptBuiltInFunction::Math_Abs:
        *inlineCandidateOpCode = Js::OpCode::InlineMathAbs;
        break;

    case Js::JavascriptBuiltInFunction::Math_Acos:
        *inlineCandidateOpCode = Js::OpCode::InlineMathAcos;
        break;

    case Js::JavascriptBuiltInFunction::Math_Asin:
        *inlineCandidateOpCode = Js::OpCode::InlineMathAsin;
        break;

    case Js::JavascriptBuiltInFunction::Math_Atan:
        *inlineCandidateOpCode = Js::OpCode::InlineMathAtan;
        break;

    case Js::JavascriptBuiltInFunction::Math_Atan2:
        *inlineCandidateOpCode = Js::OpCode::InlineMathAtan2;
        break;

    case Js::JavascriptBuiltInFunction::Math_Cos:
        *inlineCandidateOpCode = Js::OpCode::InlineMathCos;
        break;

    case Js::JavascriptBuiltInFunction::Math_Exp:
        *inlineCandidateOpCode = Js::OpCode::InlineMathExp;
        break;

    case Js::JavascriptBuiltInFunction::Math_Log:
        *inlineCandidateOpCode = Js::OpCode::InlineMathLog;
        break;

    case Js::JavascriptBuiltInFunction::Math_Pow:
        *inlineCandidateOpCode = Js::OpCode::InlineMathPow;
        break;

    case Js::JavascriptBuiltInFunction::Math_Sin:
        *inlineCandidateOpCode = Js::OpCode::InlineMathSin;
        break;

    case Js::JavascriptBuiltInFunction::Math_Sqrt:
        *inlineCandidateOpCode = Js::OpCode::InlineMathSqrt;
        break;

    case Js::JavascriptBuiltInFunction::Math_Tan:
        *inlineCandidateOpCode = Js::OpCode::InlineMathTan;
        break;

    case Js::JavascriptBuiltInFunction::Math_Floor:
        *inlineCandidateOpCode = Js::OpCode::InlineMathFloor;
        break;

    case Js::JavascriptBuiltInFunction::Math_Ceil:
        *inlineCandidateOpCode = Js::OpCode::InlineMathCeil;
        break;

    case Js::JavascriptBuiltInFunction::Math_Round:
        *inlineCandidateOpCode = Js::OpCode::InlineMathRound;
        break;

    case Js::JavascriptBuiltInFunction::Math_Min:
        *inlineCandidateOpCode = Js::OpCode::InlineMathMin;
        break;

    case Js::JavascriptBuiltInFunction::Math_Max:
        *inlineCandidateOpCode = Js::OpCode::InlineMathMax;
        break;

    case Js::JavascriptBuiltInFunction::Math_Imul:
        *inlineCandidateOpCode = Js::OpCode::InlineMathImul;
        break;

    case Js::JavascriptBuiltInFunction::Math_Clz32:
        *inlineCandidateOpCode = Js::OpCode::InlineMathClz;
        break;

    case Js::JavascriptBuiltInFunction::Math_Random:
        *inlineCandidateOpCode = Js::OpCode::InlineMathRandom;
        break;

    case Js::JavascriptBuiltInFunction::Math_Fround:
        *inlineCandidateOpCode = Js::OpCode::InlineMathFround;
        *returnType = ValueType::Float;
        break;

    case Js::JavascriptBuiltInFunction::JavascriptArray_Push:
        *inlineCandidateOpCode = Js::OpCode::InlineArrayPush;
        break;

    case Js::JavascriptBuiltInFunction::JavascriptArray_Pop:
        *inlineCandidateOpCode = Js::OpCode::InlineArrayPop;
        break;

    case Js::JavascriptBuiltInFunction::JavascriptArray_At:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Concat:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Reverse:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Shift:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Slice:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Splice:

    case Js::JavascriptBuiltInFunction::JavascriptString_At:
    case Js::JavascriptBuiltInFunction::JavascriptString_Link:
        goto CallDirectCommon;

    case Js::JavascriptBuiltInFunction::JavascriptArray_Join:
    case Js::JavascriptBuiltInFunction::JavascriptString_CharAt:
    case Js::JavascriptBuiltInFunction::JavascriptString_Concat:
    case Js::JavascriptBuiltInFunction::JavascriptString_FromCharCode:
    case Js::JavascriptBuiltInFunction::JavascriptString_FromCodePoint:
    case Js::JavascriptBuiltInFunction::JavascriptString_Replace:
    case Js::JavascriptBuiltInFunction::JavascriptString_Slice:
    case Js::JavascriptBuiltInFunction::JavascriptString_Substr:
    case Js::JavascriptBuiltInFunction::JavascriptString_Substring:
    case Js::JavascriptBuiltInFunction::JavascriptString_ToLocaleLowerCase:
    case Js::JavascriptBuiltInFunction::JavascriptString_ToLocaleUpperCase:
    case Js::JavascriptBuiltInFunction::JavascriptString_ToLowerCase:
    case Js::JavascriptBuiltInFunction::JavascriptString_ToUpperCase:
    case Js::JavascriptBuiltInFunction::JavascriptString_Trim:
    case Js::JavascriptBuiltInFunction::JavascriptString_TrimLeft:
    case Js::JavascriptBuiltInFunction::JavascriptString_TrimRight:
    case Js::JavascriptBuiltInFunction::JavascriptString_PadStart:
    case Js::JavascriptBuiltInFunction::JavascriptString_PadEnd:
        *returnType = ValueType::String;
        goto CallDirectCommon;

    case Js::JavascriptBuiltInFunction::JavascriptArray_Includes:
    case Js::JavascriptBuiltInFunction::JavascriptObject_HasOwnProperty:
    case Js::JavascriptBuiltInFunction::JavascriptObject_HasOwn:
    case Js::JavascriptBuiltInFunction::JavascriptArray_IsArray:
        *returnType = ValueType::Boolean;
        goto CallDirectCommon;

    case Js::JavascriptBuiltInFunction::JavascriptArray_IndexOf:
    case Js::JavascriptBuiltInFunction::JavascriptArray_LastIndexOf:
    case Js::JavascriptBuiltInFunction::JavascriptArray_Unshift:
    case Js::JavascriptBuiltInFunction::JavascriptString_CharCodeAt:
    case Js::JavascriptBuiltInFunction::JavascriptString_IndexOf:
    case Js::JavascriptBuiltInFunction::JavascriptString_LastIndexOf:
    case Js::JavascriptBuiltInFunction::JavascriptString_Search:
    case Js::JavascriptBuiltInFunction::JavascriptRegExp_SymbolSearch:
    case Js::JavascriptBuiltInFunction::GlobalObject_ParseInt:
        *returnType = ValueType::GetNumberAndLikelyInt(true);
        goto CallDirectCommon;

    case Js::JavascriptBuiltInFunction::JavascriptString_Split:
        *returnType = ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(true).SetArrayTypeId(Js::TypeIds_Array);
        goto CallDirectCommon;

    case Js::JavascriptBuiltInFunction::JavascriptString_Match:
    case Js::JavascriptBuiltInFunction::JavascriptRegExp_Exec:
        *returnType =
            ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(true).SetArrayTypeId(Js::TypeIds_Array)
                .Merge(ValueType::Null);
        goto CallDirectCommon;

    CallDirectCommon:
        *inlineCandidateOpCode = Js::OpCode::CallDirect;
        break;

    case Js::JavascriptBuiltInFunction::JavascriptFunction_Apply:
        *inlineCandidateOpCode = Js::OpCode::InlineFunctionApply;
        break;
    case Js::JavascriptBuiltInFunction::JavascriptFunction_Call:
        *inlineCandidateOpCode = Js::OpCode::InlineFunctionCall;
        break;
    case Js::JavascriptBuiltInFunction::EngineInterfaceObject_CallInstanceFunction:
        *inlineCandidateOpCode = Js::OpCode::InlineCallInstanceFunction;
        break;

    // The following are not currently inlined, but are tracked for their return type
    // TODO: Add more built-ins that return objects. May consider tracking all built-ins.

    case Js::JavascriptBuiltInFunction::JavascriptArray_NewInstance:
        *returnType = ValueType::GetObject(ObjectType::Array).SetHasNoMissingValues(true).SetArrayTypeId(Js::TypeIds_Array);
        break;

    case Js::JavascriptBuiltInFunction::Int8Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Int8MixedArray) : ValueType::GetObject(ObjectType::Int8Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Int8Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Uint8Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Uint8MixedArray) : ValueType::GetObject(ObjectType::Uint8Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Uint8Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Uint8ClampedArray_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Uint8ClampedMixedArray) : ValueType::GetObject(ObjectType::Uint8ClampedArray);
#else
        *returnType = ValueType::GetObject(ObjectType::Uint8ClampedArray);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Int16Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Int16MixedArray) : ValueType::GetObject(ObjectType::Int16Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Int16Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Uint16Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Uint16MixedArray) : ValueType::GetObject(ObjectType::Uint16Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Uint16Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Int32Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Int32MixedArray) : ValueType::GetObject(ObjectType::Int32Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Int32Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Uint32Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Uint32MixedArray) : ValueType::GetObject(ObjectType::Uint32Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Uint32Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Float32Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Float32MixedArray) : ValueType::GetObject(ObjectType::Float32Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Float32Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Float64Array_NewInstance:
#ifdef _M_X64
        *returnType = (!PHASE_OFF1(Js::TypedArrayVirtualPhase)) ? ValueType::GetObject(ObjectType::Float64MixedArray) : ValueType::GetObject(ObjectType::Float64Array);
#else
        *returnType = ValueType::GetObject(ObjectType::Float64Array);
#endif
        break;

    case Js::JavascriptBuiltInFunction::Int64Array_NewInstance:
        *returnType = ValueType::GetObject(ObjectType::Int64Array);
        break;

    case Js::JavascriptBuiltInFunction::Uint64Array_NewInstance:
        *returnType = ValueType::GetObject(ObjectType::Uint64Array);
        break;

    case Js::JavascriptBuiltInFunction::BoolArray_NewInstance:
        *returnType = ValueType::GetObject(ObjectType::BoolArray);
        break;

    case Js::JavascriptBuiltInFunction::CharArray_NewInstance:
        *returnType = ValueType::GetObject(ObjectType::CharArray);
        break;

    default:
        return false;
    }
    return true;
}